

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::RunListFile
          (cmMakefile *this,cmListFile *listFile,string *filenametoread,DeferCommands *defer)

{
  bool bVar1;
  string *psVar2;
  pointer pbVar3;
  const_reference lff;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables;
  DeferCommand *pDVar4;
  reference pvVar5;
  ulong uVar6;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  string local_3d0;
  string_view local_3b0;
  allocator<char> local_399;
  string local_398;
  string_view local_378;
  allocator<char> local_361;
  string local_360;
  string_view local_340;
  allocator<char> local_329;
  string local_328;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  undefined1 local_2e0 [8];
  cmExecutionStatus status_1;
  DeferCallScope callScope;
  string id;
  DeferCommand *d;
  size_t i_1;
  DeferScope scope;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  undefined1 local_228 [8];
  cmExecutionStatus status;
  size_t i;
  size_t numberFunctions;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  string local_158;
  string_view local_138;
  allocator<char> local_121;
  string local_120;
  string_view local_100;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string currentFile;
  allocator<char> local_69;
  string local_68;
  string local_48 [8];
  string currentParentFile;
  DeferCommands *defer_local;
  string *filenametoread_local;
  cmListFile *listFile_local;
  cmMakefile *this_local;
  
  currentParentFile.field_2._8_8_ = defer;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_PARENT_LIST_FILE",&local_69);
  psVar2 = GetSafeDefinition(this,&local_68);
  std::__cxx11::string::string(local_48,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CMAKE_CURRENT_LIST_FILE",&local_c1);
  psVar2 = GetSafeDefinition(this,&local_c0);
  std::__cxx11::string::string((string *)local_a0,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CMAKE_CURRENT_LIST_FILE",&local_e9);
  local_100 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)filenametoread);
  AddDefinition(this,&local_e8,local_100);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"CMAKE_CURRENT_LIST_DIR",&local_121);
  cmsys::SystemTools::GetFilenamePath(&local_158,filenametoread);
  local_138 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_158);
  AddDefinition(this,&local_120,local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"CMAKE_PARENT_LIST_FILE",&local_179);
  MarkVariableAsUsed(this,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"CMAKE_CURRENT_LIST_FILE",&local_1a1);
  MarkVariableAsUsed(this,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"CMAKE_CURRENT_LIST_DIR",
             (allocator<char> *)((long)&numberFunctions + 7));
  MarkVariableAsUsed(this,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&numberFunctions + 7));
  pbVar3 = (pointer)std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                              (&listFile->Functions);
  for (status.Variables.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      status.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage < pbVar3;
      status.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)&(status.Variables.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1) {
    cmExecutionStatus::cmExecutionStatus((cmExecutionStatus *)local_228,this);
    lff = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                    (&listFile->Functions,
                     (size_type)
                     status.Variables.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_250);
    ExecuteCommand(this,lff,(cmExecutionStatus *)local_228,&local_250);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_250);
    bVar1 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar1) {
      scope.Makefile._4_4_ = 2;
    }
    else {
      bVar1 = cmExecutionStatus::GetReturnInvoked((cmExecutionStatus *)local_228);
      if (bVar1) {
        variables = cmExecutionStatus::GetReturnVariables_abi_cxx11_((cmExecutionStatus *)local_228)
        ;
        RaiseScope(this,variables);
        scope.Makefile._4_4_ = 2;
      }
      else {
        scope.Makefile._4_4_ = 0;
      }
    }
    cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_228);
    if (scope.Makefile._4_4_ != 0) break;
  }
  if (currentParentFile.field_2._8_8_ != 0) {
    DeferScope::DeferScope((DeferScope *)&i_1,this,filenametoread);
    d = (DeferCommand *)0x0;
    while( true ) {
      pDVar4 = (DeferCommand *)
               std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>::
               size((vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_> *)
                    currentParentFile.field_2._8_8_);
      if (pDVar4 <= d) break;
      pvVar5 = std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>::
               operator[]((vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
                           *)currentParentFile.field_2._8_8_,(size_type)d);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::__cxx11::string::string((string *)&callScope,(string *)pvVar5);
        DeferCallScope::DeferCallScope
                  ((DeferCallScope *)
                   &status_1.Variables.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,this,&pvVar5->FilePath);
        cmExecutionStatus::cmExecutionStatus((cmExecutionStatus *)local_2e0,this);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&callScope);
        ExecuteCommand(this,&pvVar5->Command,(cmExecutionStatus *)local_2e0,&local_308);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_308);
        bVar1 = cmSystemTools::GetFatalErrorOccurred();
        if (bVar1) {
          scope.Makefile._4_4_ = 5;
        }
        else {
          scope.Makefile._4_4_ = 0;
        }
        cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_2e0);
        DeferCallScope::~DeferCallScope
                  ((DeferCallScope *)
                   &status_1.Variables.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&callScope);
        if (scope.Makefile._4_4_ != 0) break;
      }
      d = (DeferCommand *)&(d->Id).field_0x1;
    }
    DeferScope::~DeferScope((DeferScope *)&i_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"CMAKE_PARENT_LIST_FILE",&local_329);
  local_340 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
  AddDefinition(this,&local_328,local_340);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"CMAKE_CURRENT_LIST_FILE",&local_361);
  local_378 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a0);
  AddDefinition(this,&local_360,local_378);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"CMAKE_CURRENT_LIST_DIR",&local_399);
  cmsys::SystemTools::GetFilenamePath(&local_3d0,(string *)local_a0);
  local_3b0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3d0);
  AddDefinition(this,&local_398,local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"CMAKE_PARENT_LIST_FILE",&local_3f1);
  MarkVariableAsUsed(this,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"CMAKE_CURRENT_LIST_FILE",&local_419);
  MarkVariableAsUsed(this,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"CMAKE_CURRENT_LIST_DIR",&local_441);
  MarkVariableAsUsed(this,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmMakefile::RunListFile(cmListFile const& listFile,
                             std::string const& filenametoread,
                             DeferCommands* defer)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile =
    this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread);
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(filenametoread));

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for (size_t i = 0; i < numberFunctions; ++i) {
    cmExecutionStatus status(*this);
    this->ExecuteCommand(listFile.Functions[i], status);
    if (cmSystemTools::GetFatalErrorOccurred()) {
      break;
    }
    if (status.GetReturnInvoked()) {
      this->RaiseScope(status.GetReturnVariables());
      // Exit early due to return command.
      break;
    }
  }

  // Run any deferred commands.
  if (defer) {
    // Add a backtrace level indicating calls are deferred.
    DeferScope scope(this, filenametoread);

    // Iterate by index in case one deferred call schedules another.
    // NOLINTNEXTLINE(modernize-loop-convert)
    for (size_t i = 0; i < defer->Commands.size(); ++i) {
      DeferCommand& d = defer->Commands[i];
      if (d.Id.empty()) {
        // Canceled.
        continue;
      }
      // Mark as executed.
      std::string id = std::move(d.Id);

      // The deferred call may have come from another file.
      DeferCallScope callScope(this, d.FilePath);

      cmExecutionStatus status(*this);
      this->ExecuteCommand(d.Command, status, std::move(id));
      if (cmSystemTools::GetFatalErrorOccurred()) {
        break;
      }
    }
  }

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile);
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile);
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile));
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}